

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O0

void __thiscall cs::statement_for::dump(statement_for *this,ostream *o)

{
  bool bVar1;
  reference ppsVar2;
  ostream *in_RSI;
  _Self *in_RDI;
  statement_base **ptr;
  const_iterator __end1;
  const_iterator __begin1;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *__range1;
  _Self *in_stack_ffffffffffffff78;
  ostream *in_stack_ffffffffffffff98;
  iterator in_stack_ffffffffffffffa0;
  _Deque_iterator<cs::statement_base_*,_cs::statement_base_*const_&,_cs::statement_base_*const_*>
  local_50;
  _Elt_pointer *local_30;
  tree_node *local_28;
  tree_node *local_20;
  tree_node *local_18;
  ostream *local_10;
  
  local_10 = in_RSI;
  std::operator<<(in_RSI,"< BeginFor >\n");
  std::operator<<(local_10,"< Iterator = ");
  std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>::
  operator[]((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
              *)in_RDI,(size_type)in_stack_ffffffffffffff78);
  local_18 = (tree_node *)
             tree_type<cs::token_base_*>::root
                       ((tree_type<cs::token_base_*> *)in_stack_ffffffffffffff78);
  compiler_type::dump_expr(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::operator<<(local_10," >\n< Condition = ");
  std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>::
  operator[]((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
              *)in_RDI,(size_type)in_stack_ffffffffffffff78);
  local_20 = (tree_node *)
             tree_type<cs::token_base_*>::root
                       ((tree_type<cs::token_base_*> *)in_stack_ffffffffffffff78);
  compiler_type::dump_expr(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::operator<<(local_10," >\n< Increment = ");
  std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>::
  operator[]((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
              *)in_RDI,(size_type)in_stack_ffffffffffffff78);
  local_28 = (tree_node *)
             tree_type<cs::token_base_*>::root
                       ((tree_type<cs::token_base_*> *)in_stack_ffffffffffffff78);
  compiler_type::dump_expr(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::operator<<(local_10," >\n< Body >\n");
  local_30 = (_Elt_pointer *)&in_RDI[3]._M_last;
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::begin
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
             in_stack_ffffffffffffff78);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::end
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
             in_stack_ffffffffffffff78);
  while( true ) {
    bVar1 = std::operator!=(in_RDI,in_stack_ffffffffffffff78);
    if (!bVar1) break;
    ppsVar2 = std::
              _Deque_iterator<cs::statement_base_*,_cs::statement_base_*const_&,_cs::statement_base_*const_*>
              ::operator*(&local_50);
    (*(*ppsVar2)->_vptr_statement_base[5])(*ppsVar2,local_10);
    std::
    _Deque_iterator<cs::statement_base_*,_cs::statement_base_*const_&,_cs::statement_base_*const_*>
    ::operator++(in_RDI);
  }
  std::operator<<(local_10,"< EndFor >\n");
  return;
}

Assistant:

void statement_for::dump(std::ostream &o) const
	{
		o << "< BeginFor >\n";
		o << "< Iterator = ";
		compiler_type::dump_expr(mParallel[0].root(), o);
		o << " >\n< Condition = ";
		compiler_type::dump_expr(mParallel[1].root(), o);
		o << " >\n< Increment = ";
		compiler_type::dump_expr(mParallel[2].root(), o);
		o << " >\n< Body >\n";
		for (auto &ptr: mBlock)
			ptr->dump(o);
		o << "< EndFor >\n";
	}